

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::DefToProto_TestRuntimeReflection_Test::~DefToProto_TestRuntimeReflection_Test
          (DefToProto_TestRuntimeReflection_Test *this)

{
  DefToProto_TestRuntimeReflection_Test *this_local;
  
  ~DefToProto_TestRuntimeReflection_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DefToProto, TestRuntimeReflection) {
  upb::Arena arena;
  upb::DefPool defpool;
  upb_StringView test_file_desc =
      upb_util_def_to_proto_test_proto_upbdefinit.descriptor;
  const auto* file_desc = google_protobuf_FileDescriptorProto_parse(
      test_file_desc.data, test_file_desc.size, arena.ptr());

  _upb_DefPool_LoadDefInitEx(
      defpool.ptr(),
      &upb_util_def_to_proto_test_proto_upbdefinit, true);
  upb::FileDefPtr file = defpool.FindFileByName(
      upb_util_def_to_proto_test_proto_upbdefinit.filename);
  CheckFile(file, file_desc);
}